

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

wchar_t assertion_file_time(char *file,wchar_t line,char *pathname,long t,long nsec,char type,
                           wchar_t recent)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  timespec *ptVar4;
  time_t tVar5;
  char *__file;
  wchar_t line_00;
  char *filename;
  undefined7 in_register_00000089;
  uint uVar6;
  stat sStack_180;
  char *pcStack_f0;
  ulong uStack_e8;
  char *pcStack_e0;
  char *pcStack_d8;
  code *pcStack_d0;
  stat st;
  stat *__buf;
  char *pcVar7;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __buf = &st;
  pcStack_d0 = (code *)0x103ed9;
  iVar3 = lstat(pathname,(stat *)__buf);
  line_00 = (wchar_t)__buf;
  if (iVar3 == 0) {
    uVar6 = (uint)(char)nsec;
    pcVar7 = (char *)(ulong)uVar6;
    if (uVar6 == 0x61) {
      ptVar4 = &st.st_atim;
    }
    else {
      if (uVar6 == 0x62) {
        return L'\x01';
      }
      if (uVar6 != 0x6d) {
        pcStack_d0 = assertion_file_mode;
        filename = pcVar7;
        assertion_file_time_cold_1();
        assertions = assertions + L'\x01';
        msg = nextmsg;
        nextmsg = (char *)0x0;
        pcStack_f0 = pathname;
        uStack_e8 = CONCAT71(in_register_00000089,type) & 0xffffffff;
        pcStack_e0 = file;
        pcStack_d8 = pcVar7;
        pcStack_d0 = (code *)(ulong)(uint)line;
        iVar3 = lstat(__file,&sStack_180);
        uVar6 = sStack_180.st_mode & 0x1ff;
        bVar2 = uVar6 == (uint)t;
        if (!bVar2 || iVar3 != 0) {
          failure_start(filename,line_00,"File %s has mode %o, expected %o",__file,(ulong)uVar6,
                        t & 0xffffffff);
          failure_finish(filename);
        }
        return (uint)(bVar2 && iVar3 == 0);
      }
      ptVar4 = &st.st_mtim;
    }
    lVar1 = ptVar4->tv_sec;
    if ((int)CONCAT71(in_register_00000089,type) == 0) {
      if (lVar1 == t) {
        return L'\x01';
      }
      pcStack_d8 = (char *)0x0;
      uStack_e8 = 0;
      pcStack_f0 = (char *)0x103fcf;
      pcStack_e0 = (char *)t;
      failure_start(file,line,"File %s has %ctime %lld.%09lld, expected %ld.%09ld",pathname,pcVar7);
    }
    else {
      pcStack_d0 = (code *)0x103f51;
      tVar5 = time((time_t *)0x0);
      if (lVar1 <= tVar5 + 1 && tVar5 + -10 <= lVar1) {
        return L'\x01';
      }
      pcStack_d8 = (char *)(tVar5 - lVar1);
      pcStack_e0 = (char *)0x103f94;
      failure_start(file,line,"File %s has %ctime %lld, %lld seconds ago\n",pathname,pcVar7,lVar1);
    }
  }
  else {
    pcStack_d0 = (code *)0x103ef3;
    failure_start(file,line,"Can\'t stat %s\n",pathname);
  }
  pcStack_d0 = (code *)0x103ef8;
  failure_finish(file);
  return L'\0';
}

Assistant:

static int
assertion_file_time(const char *file, int line,
    const char *pathname, long t, long nsec, char type, int recent)
{
	long long filet, filet_nsec;
	int r;

#if defined(_WIN32) && !defined(__CYGWIN__)
#define EPOC_TIME	(116444736000000000ULL)
	FILETIME fxtime, fbirthtime, fatime, fmtime;
	ULARGE_INTEGER wintm;
	HANDLE h;
	fxtime.dwLowDateTime = 0;
	fxtime.dwHighDateTime = 0;

	assertion_count(file, line);
	/* Note: FILE_FLAG_BACKUP_SEMANTICS applies to open
	 * a directory file. If not, CreateFile() will fail when
	 * the pathname is a directory. */
	h = CreateFileA(pathname, FILE_READ_ATTRIBUTES, 0, NULL,
	    OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, NULL);
	if (h == INVALID_HANDLE_VALUE) {
		failure_start(file, line, "Can't access %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	r = GetFileTime(h, &fbirthtime, &fatime, &fmtime);
	switch (type) {
	case 'a': fxtime = fatime; break;
	case 'b': fxtime = fbirthtime; break;
	case 'm': fxtime = fmtime; break;
	}
	CloseHandle(h);
	if (r == 0) {
		failure_start(file, line, "Can't GetFileTime %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	wintm.LowPart = fxtime.dwLowDateTime;
	wintm.HighPart = fxtime.dwHighDateTime;
	filet = (wintm.QuadPart - EPOC_TIME) / 10000000;
	filet_nsec = ((wintm.QuadPart - EPOC_TIME) % 10000000) * 100;
	nsec = (nsec / 100) * 100; /* Round the request */
#else
	struct stat st;

	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0) {
		failure_start(file, line, "Can't stat %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	switch (type) {
	case 'a': filet = st.st_atime; break;
	case 'm': filet = st.st_mtime; break;
	case 'b': filet = 0; break;
	default: fprintf(stderr, "INTERNAL: Bad type %c for file time", type);
		exit(1);
	}
#if defined(__FreeBSD__)
	switch (type) {
	case 'a': filet_nsec = st.st_atimespec.tv_nsec; break;
	case 'b': filet = st.st_birthtime;
		/* FreeBSD filesystems that don't support birthtime
		 * (e.g., UFS1) always return -1 here. */
		if (filet == -1) {
			return (1);
		}
		filet_nsec = st.st_birthtimespec.tv_nsec; break;
	case 'm': filet_nsec = st.st_mtimespec.tv_nsec; break;
	default: fprintf(stderr, "INTERNAL: Bad type %c for file time", type);
		exit(1);
	}
	/* FreeBSD generally only stores to microsecond res, so round. */
	filet_nsec = (filet_nsec / 1000) * 1000;
	nsec = (nsec / 1000) * 1000;
#else
	filet_nsec = nsec = 0;	/* Generic POSIX only has whole seconds. */
	if (type == 'b') return (1); /* Generic POSIX doesn't have birthtime */
#if defined(__HAIKU__)
	if (type == 'a') return (1); /* Haiku doesn't have atime. */
#endif
#endif
#endif
	if (recent) {
		/* Check that requested time is up-to-date. */
		time_t now = time(NULL);
		if (filet < now - 10 || filet > now + 1) {
			failure_start(file, line,
			    "File %s has %ctime %lld, %lld seconds ago\n",
			    pathname, type, filet, now - filet);
			failure_finish(NULL);
			return (0);
		}
	} else if (filet != t || filet_nsec != nsec) {
		failure_start(file, line,
		    "File %s has %ctime %lld.%09lld, expected %ld.%09ld",
		    pathname, type, filet, filet_nsec, t, nsec);
		failure_finish(NULL);
		return (0);
	}
	return (1);
}